

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_sp.c
# Opt level: O2

int16_t WebRtcVad_FindMinimum(VadInstT *self,int16_t feature_value,int channel)

{
  undefined2 uVar1;
  int16_t iVar2;
  int iVar3;
  uint uVar5;
  short sVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int16_t *piVar4;
  
  if (5 < channel) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/common_audio/vad/vad_sp.c"
            ,0x49,"DCHECK failed: (channel) < (kNumChannels)");
    exit(1);
  }
  lVar7 = (long)(channel << 4);
  piVar4 = self->low_value_vector + lVar7;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    lVar10 = lVar8;
    if (self->index_vector[lVar7 + lVar8] == 100) {
      for (; lVar10 != 0xf; lVar10 = lVar10 + 1) {
        iVar2 = self->index_vector[lVar7 + lVar10 + 1];
        self->low_value_vector[lVar7 + lVar10] = self->low_value_vector[lVar7 + lVar10 + 1];
        self->index_vector[lVar7 + lVar10] = iVar2;
      }
      self->index_vector[lVar7 + 0xf] = 0x65;
      self->low_value_vector[lVar7 + 0xf] = 10000;
    }
    else {
      self->index_vector[lVar7 + lVar8] = self->index_vector[lVar7 + lVar8] + 1;
    }
  }
  if (feature_value < self->low_value_vector[lVar7 + 7]) {
    if (feature_value < self->low_value_vector[lVar7 + 3]) {
      if (feature_value < self->low_value_vector[lVar7 + 1]) {
        uVar9 = (ulong)(*piVar4 <= feature_value);
      }
      else {
        uVar9 = (ulong)(feature_value < self->low_value_vector[lVar7 + 2]) ^ 3;
      }
    }
    else if (feature_value < self->low_value_vector[lVar7 + 5]) {
      uVar9 = (ulong)(feature_value < self->low_value_vector[lVar7 + 4]) ^ 5;
    }
    else {
      uVar9 = (ulong)(feature_value < self->low_value_vector[lVar7 + 6]) ^ 7;
    }
LAB_0011ee2d:
    for (lVar8 = 0xfd; uVar9 < lVar8 - 0xeeU; lVar8 = lVar8 + -1) {
      uVar1 = *(undefined2 *)((long)self + lVar8 * 2 + lVar7 * 2 + -0xc2);
      *(undefined2 *)((long)self->downsampling_filter_states + lVar8 * 2 + lVar7 * 2 + -4) =
           *(undefined2 *)((long)self->downsampling_filter_states + lVar8 * 2 + lVar7 * 2 + -6);
      *(undefined2 *)((long)self + lVar8 * 2 + lVar7 * 2 + -0xc0) = uVar1;
    }
    uVar9 = (ulong)(uint)((int)uVar9 * 2);
    *(int16_t *)((long)piVar4 + uVar9) = feature_value;
    *(undefined2 *)((long)self->index_vector + uVar9 + lVar7 * 2) = 1;
  }
  else if (feature_value < self->low_value_vector[lVar7 + 0xf]) {
    if (feature_value < self->low_value_vector[lVar7 + 0xb]) {
      if (feature_value < self->low_value_vector[lVar7 + 9]) {
        uVar9 = (ulong)(feature_value < self->low_value_vector[lVar7 + 8]) ^ 9;
      }
      else {
        uVar9 = (ulong)(feature_value < self->low_value_vector[lVar7 + 10]) ^ 0xb;
      }
    }
    else if (feature_value < self->low_value_vector[lVar7 + 0xd]) {
      uVar9 = (ulong)(feature_value < self->low_value_vector[lVar7 + 0xc]) ^ 0xd;
    }
    else {
      uVar9 = (ulong)(feature_value < self->low_value_vector[lVar7 + 0xe]) ^ 0xf;
    }
    goto LAB_0011ee2d;
  }
  if (self->frame_counter < 3) {
    if (self->frame_counter < 1) {
      sVar6 = self->mean_value[channel];
      uVar5 = 0;
      iVar3 = 0x640;
      goto LAB_0011eea9;
    }
  }
  else {
    piVar4 = self->low_value_vector + lVar7 + 2;
  }
  iVar3 = (int)*piVar4;
  sVar6 = self->mean_value[channel];
  uVar5 = 0x7eb7;
  if (*piVar4 < sVar6) {
    uVar5 = 0x1999;
  }
LAB_0011eea9:
  iVar2 = (int16_t)((uVar5 ^ 0x7fff) * iVar3 + (int)sVar6 * (uVar5 + 1) + 0x4000 >> 0xf);
  self->mean_value[channel] = iVar2;
  return iVar2;
}

Assistant:

int16_t WebRtcVad_FindMinimum(VadInstT* self,
                              int16_t feature_value,
                              int channel) {
  int i = 0, j = 0;
  int position = -1;
  // Offset to beginning of the 16 minimum values in memory.
  const int offset = (channel << 4);
  int16_t current_median = 1600;
  int16_t alpha = 0;
  int32_t tmp32 = 0;
  // Pointer to memory for the 16 minimum values and the age of each value of
  // the `channel`.
  int16_t* age = &self->index_vector[offset];
  int16_t* smallest_values = &self->low_value_vector[offset];

  RTC_DCHECK_LT(channel, kNumChannels);

  // Each value in `smallest_values` is getting 1 loop older. Update `age`, and
  // remove old values.
  for (i = 0; i < 16; i++) {
    if (age[i] != 100) {
      age[i]++;
    } else {
      // Too old value. Remove from memory and shift larger values downwards.
      for (j = i; j < 15; j++) {
        smallest_values[j] = smallest_values[j + 1];
        age[j] = age[j + 1];
      }
      age[15] = 101;
      smallest_values[15] = 10000;
    }
  }

  // Check if `feature_value` is smaller than any of the values in
  // `smallest_values`. If so, find the `position` where to insert the new value
  // (`feature_value`).
  if (feature_value < smallest_values[7]) {
    if (feature_value < smallest_values[3]) {
      if (feature_value < smallest_values[1]) {
        if (feature_value < smallest_values[0]) {
          position = 0;
        } else {
          position = 1;
        }
      } else if (feature_value < smallest_values[2]) {
        position = 2;
      } else {
        position = 3;
      }
    } else if (feature_value < smallest_values[5]) {
      if (feature_value < smallest_values[4]) {
        position = 4;
      } else {
        position = 5;
      }
    } else if (feature_value < smallest_values[6]) {
      position = 6;
    } else {
      position = 7;
    }
  } else if (feature_value < smallest_values[15]) {
    if (feature_value < smallest_values[11]) {
      if (feature_value < smallest_values[9]) {
        if (feature_value < smallest_values[8]) {
          position = 8;
        } else {
          position = 9;
        }
      } else if (feature_value < smallest_values[10]) {
        position = 10;
      } else {
        position = 11;
      }
    } else if (feature_value < smallest_values[13]) {
      if (feature_value < smallest_values[12]) {
        position = 12;
      } else {
        position = 13;
      }
    } else if (feature_value < smallest_values[14]) {
      position = 14;
    } else {
      position = 15;
    }
  }

  // If we have detected a new small value, insert it at the correct position
  // and shift larger values up.
  if (position > -1) {
    for (i = 15; i > position; i--) {
      smallest_values[i] = smallest_values[i - 1];
      age[i] = age[i - 1];
    }
    smallest_values[position] = feature_value;
    age[position] = 1;
  }

  // Get `current_median`.
  if (self->frame_counter > 2) {
    current_median = smallest_values[2];
  } else if (self->frame_counter > 0) {
    current_median = smallest_values[0];
  }

  // Smooth the median value.
  if (self->frame_counter > 0) {
    if (current_median < self->mean_value[channel]) {
      alpha = kSmoothingDown;  // 0.2 in Q15.
    } else {
      alpha = kSmoothingUp;  // 0.99 in Q15.
    }
  }
  tmp32 = (alpha + 1) * self->mean_value[channel];
  tmp32 += (WEBRTC_SPL_WORD16_MAX - alpha) * current_median;
  tmp32 += 16384;
  self->mean_value[channel] = (int16_t) (tmp32 >> 15);

  return self->mean_value[channel];
}